

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *
deqp::gles31::Functional::anon_unknown_1::TextureTraits<glu::Texture3D>::
createTextureFromInternalFormat
          (MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *__return_storage_ptr__,
          RenderContext *renderCtx,deUint32 texFormat,IVec3 *size)

{
  Texture3D *this;
  MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *extraout_RAX;
  
  this = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (this,renderCtx,texFormat,size->m_data[0],size->m_data[1],size->m_data[2]);
  (__return_storage_ptr__->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).
  m_data.ptr = this;
  return extraout_RAX;
}

Assistant:

static de::MovePtr<glu::Texture3D> createTextureFromInternalFormat (glu::RenderContext& renderCtx, deUint32 texFormat, const tcu::IVec3& size)
	{
		return de::MovePtr<glu::Texture3D>(new glu::Texture3D(renderCtx, texFormat, size.x(), size.y(), size.z()));
	}